

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O3

void __thiscall Flasher::lock(Flasher *this,string *regionArg,bool enable)

{
  Flash *pFVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  string sub;
  bool local_a1;
  Flasher *local_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  _Bit_type *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  local_a1 = enable;
  if (regionArg->_M_string_length == 0) {
    pcVar6 = "Unlock";
    if (enable) {
      pcVar6 = "Lock";
    }
    (*this->_observer->_vptr_FlasherObserver[2])(this->_observer,"%s all regions\n",pcVar6);
    uVar2 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
               super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
               super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[7])();
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_98,(ulong)uVar2,&local_a1,(allocator_type *)&local_70);
    pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
    (*pFVar1->_vptr_Flash[0xb])(pFVar1,&local_98);
    if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p == (_Bit_type *)0x0) {
      return;
    }
    uVar4 = (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage -
            (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  }
  else {
    local_70 = (_Bit_type *)&local_60;
    local_68 = 0;
    local_60 = '\0';
    local_a0 = this;
    (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
       super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
       super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[10])(&local_98);
    pcVar6 = "Unlock";
    if (enable) {
      pcVar6 = "Lock";
    }
    do {
      lVar3 = std::__cxx11::string::find((char)regionArg,0x2c);
      std::__cxx11::string::substr((ulong)local_50,(ulong)regionArg);
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar4 = strtol((char *)local_70,(char **)0x0,0);
      (*local_a0->_observer->_vptr_FlasherObserver[2])
                (local_a0->_observer,"%s region %d\n",pcVar6,uVar4 & 0xffffffff);
      uVar5 = uVar4 >> 6 & 0x3ffffff;
      uVar4 = 1L << ((byte)uVar4 & 0x3f);
      if (enable) {
        uVar4 = uVar4 | local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
      }
      else {
        uVar4 = ~uVar4 & local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
      }
      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar5] = uVar4;
    } while (lVar3 != -1);
    pFVar1 = (local_a0->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t
             .super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
    (*pFVar1->_vptr_Flash[0xb])(pFVar1,&local_98);
    if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_70 == (_Bit_type *)&local_60) {
      return;
    }
    uVar4 = CONCAT71(uStack_5f,local_60) + 1;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = local_70;
  }
  operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,uVar4);
  return;
}

Assistant:

void
Flasher::lock(string& regionArg, bool enable)
{
    if (regionArg.empty())
    {
        _observer.onStatus("%s all regions\n", enable ? "Lock" : "Unlock");
        std::vector<bool> regions(_flash->lockRegions(), enable);
        _flash->setLockRegions(regions);
    }
    else
    {
        size_t pos = 0;
        size_t delim;
        uint32_t region;
        string sub;
        std::vector<bool> regions = _flash->getLockRegions();

        do
        {
            delim = regionArg.find(',', pos);
            sub = regionArg.substr(pos, delim - pos);
            region = strtol(sub.c_str(), NULL, 0);
            _observer.onStatus("%s region %d\n", enable ? "Lock" : "Unlock", region);
            regions[region] = enable;
            pos = delim + 1;
        } while (delim != string::npos);

        _flash->setLockRegions(regions);
    }
}